

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> * __thiscall
kj::ArrayBuilder<kj::ArrayPtr<const_capnp::word>_>::operator=
          (ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> *this,
          ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> *other)

{
  ArrayPtr<const_capnp::word> *pAVar1;
  RemoveConst<kj::ArrayPtr<const_capnp::word>_> *pRVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  ArrayDisposer *pAVar4;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (ArrayPtr<const_capnp::word> *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->ptr = (ArrayPtr<const_capnp::word> *)0x0;
    this->pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
    this->endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pAVar1,0x10,(long)pRVar2 - (long)pAVar1 >> 4,
               (long)pAVar3 - (long)pAVar1 >> 4,0);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (ArrayPtr<const_capnp::word> *)0x0;
  other->pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
  other->endPtr = (ArrayPtr<const_capnp::word> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }